

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryCondition::
~GeometryShaderLayeredRenderingBoundaryCondition
          (GeometryShaderLayeredRenderingBoundaryCondition *this)

{
  pointer pTVar1;
  
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderLayeredRenderingBoundaryCondition_02110128;
  if (this->m_blue_color != (uchar *)0x0) {
    operator_delete__(this->m_blue_color);
    this->m_blue_color = (uchar *)0x0;
  }
  if (this->m_green_color != (uchar *)0x0) {
    operator_delete__(this->m_green_color);
    this->m_green_color = (uchar *)0x0;
  }
  if (this->m_red_color != (uchar *)0x0) {
    operator_delete__(this->m_red_color);
    this->m_red_color = (uchar *)0x0;
  }
  if (this->m_white_color != (uchar *)0x0) {
    operator_delete__(this->m_white_color);
    this->m_white_color = (uchar *)0x0;
  }
  pTVar1 = (this->m_textures_info).
           super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)(this->m_textures_info).
                                 super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar1);
  }
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCaseBase_0210f178;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->super_TestCaseBase).m_specializationMap._M_t);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

GeometryShaderLayeredRenderingBoundaryCondition::~GeometryShaderLayeredRenderingBoundaryCondition(void)
{
	if (m_blue_color)
	{
		delete[] m_blue_color;
		m_blue_color = 0;
	}

	if (m_green_color)
	{
		delete[] m_green_color;
		m_green_color = 0;
	}

	if (m_red_color)
	{
		delete[] m_red_color;
		m_red_color = 0;
	}
	if (m_white_color)
	{
		delete[] m_white_color;
		m_white_color = 0;
	}
}